

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_decl_multi(CPState *cp)

{
  bool bVar1;
  int iVar2;
  CPToken CVar3;
  CPscl CVar4;
  CTypeID id_00;
  CPState *in_RDI;
  CTypeID aid;
  CType *cta;
  CTypeID id;
  CType *ct;
  CTypeID ctypeid;
  CTInfo info;
  CPToken tok;
  BCLine hashline;
  CPscl scl;
  CPDecl decl;
  int first;
  undefined4 in_stack_fffffffffffff878;
  CTypeID in_stack_fffffffffffff87c;
  CPState *in_stack_fffffffffffff880;
  undefined4 in_stack_fffffffffffff888;
  CTypeID in_stack_fffffffffffff88c;
  CTState *in_stack_fffffffffffff890;
  undefined4 in_stack_fffffffffffff898;
  CTypeID in_stack_fffffffffffff89c;
  uint in_stack_fffffffffffff8a0;
  CPToken in_stack_fffffffffffff8a4;
  GCstr *local_738;
  GCstr *local_730;
  CTypeID in_stack_fffffffffffff8d8;
  CTInfo in_stack_fffffffffffff8dc;
  CPState *in_stack_fffffffffffff8e0;
  CType local_710 [6];
  CType *local_c0;
  
  bVar1 = true;
  while( true ) {
    while( true ) {
      while( true ) {
        if (in_RDI->tok == 0x103) {
          return;
        }
        iVar2 = cp_opt((CPState *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),0);
        if (iVar2 == 0) break;
        bVar1 = false;
      }
      if (in_RDI->tok != 0x23) break;
      in_stack_fffffffffffff8a4 = cp_next((CPState *)0x1aa051);
      if (in_stack_fffffffffffff8a4 == 0x102) {
        cp_line(in_stack_fffffffffffff880,in_stack_fffffffffffff87c);
      }
      else if (((in_stack_fffffffffffff8a4 == 0x100) && (in_RDI->str->len == 4)) &&
              (in_RDI->str[1].nextgc.gcptr32 == 0x656e696c)) {
        CVar3 = cp_next((CPState *)0x1aa0c3);
        if (CVar3 != 0x102) {
          cp_err_token(in_stack_fffffffffffff880,in_stack_fffffffffffff87c);
        }
        cp_line(in_stack_fffffffffffff880,in_stack_fffffffffffff87c);
      }
      else {
        if (((in_stack_fffffffffffff8a4 != 0x100) || (in_RDI->str->len != 6)) ||
           (iVar2 = memcmp(in_RDI->str + 1,"pragma",6), iVar2 != 0)) {
          cp_errmsg(in_RDI,(CPToken)(ulong)(uint)in_RDI->tok,LJ_ERR_XSYMBOL);
        }
        cp_pragma(in_stack_fffffffffffff880,in_stack_fffffffffffff87c);
      }
    }
    CVar4 = cp_decl_spec((CPState *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                         (CPDecl *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                         (CPscl)((ulong)in_stack_fffffffffffff890 >> 0x20));
    if (((in_RDI->tok != 0x3b) && (in_RDI->tok != 0x103)) || (local_710[0].info >> 0x1c != 7))
    break;
    local_c0 = local_710;
    do {
      local_c0 = in_RDI->cts->tab + (local_c0->info & 0xffff);
    } while (local_c0->info >> 0x1c == 8);
    in_stack_fffffffffffff8a0 = local_c0->info;
    if ((in_stack_fffffffffffff8a0 >> 0x1c != 1) && (in_stack_fffffffffffff8a0 >> 0x1c != 5)) break;
LAB_001aa5bc:
    if ((in_RDI->tok == 0x103) && (bVar1)) {
      return;
    }
    bVar1 = false;
    cp_check(in_stack_fffffffffffff880,in_stack_fffffffffffff87c);
  }
  do {
    cp_declarator((CPState *)in_stack_fffffffffffff890,
                  (CPDecl *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
    id_00 = cp_decl_intern(in_stack_fffffffffffff8e0,
                           (CPDecl *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
    in_stack_fffffffffffff89c = id_00;
    if ((local_738 != (GCstr *)0x0) && (in_stack_fffffffffffff8d8 == 0)) {
      if ((CVar4 & 0x8000) == 0) {
        if (in_RDI->cts->tab[id_00].info >> 0x1c == 6) {
          in_stack_fffffffffffff890 = (CTState *)(in_RDI->cts->tab + id_00);
        }
        else {
          if ((CVar4 & 0x20000) != 0) {
            id_00 = cp_decl_constinit((CPState *)
                                      CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                      (CType **)CONCAT44(id_00,in_stack_fffffffffffff898),
                                      (CTypeID)((ulong)in_stack_fffffffffffff890 >> 0x20));
            goto LAB_001aa537;
          }
          id_00 = lj_ctype_new(in_stack_fffffffffffff890,
                               (CType **)
                               CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
          *(CTypeID *)&in_stack_fffffffffffff890->tab = in_stack_fffffffffffff89c + 0xc0000000;
        }
        if (local_730 != (GCstr *)0x0) {
          in_stack_fffffffffffff87c =
               lj_ctype_new(in_stack_fffffffffffff890,
                            (CType **)CONCAT44(id_00,in_stack_fffffffffffff888));
          in_stack_fffffffffffff890 = (CTState *)(in_RDI->cts->tab + id_00);
          in_stack_fffffffffffff880->c = -0x7ffc0000;
          *(CTypeID1 *)&(in_stack_fffffffffffff880->val).field_0 =
               *(CTypeID1 *)&((CPValue *)&in_stack_fffffffffffff890->top)->field_0;
          *(CTypeID1 *)&((CPValue *)&in_stack_fffffffffffff890->top)->field_0 =
               (CTypeID1)in_stack_fffffffffffff87c;
          local_730->marked = local_730->marked | 0x20;
          (in_stack_fffffffffffff880->val).id = (CTypeID)local_730;
        }
      }
      else {
        id_00 = lj_ctype_new(in_stack_fffffffffffff890,
                             (CType **)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888)
                            );
        *(CTypeID *)&in_stack_fffffffffffff890->tab = in_stack_fffffffffffff89c + 0x70000000;
      }
LAB_001aa537:
      local_738->marked = local_738->marked | 0x20;
      in_stack_fffffffffffff890->sizetab = (CTypeID)local_738;
      lj_ctype_addname(in_RDI->cts,(CType *)in_stack_fffffffffffff890,id_00);
      in_stack_fffffffffffff88c = id_00;
    }
    iVar2 = cp_opt((CPState *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),0);
    if (iVar2 == 0) goto LAB_001aa5bc;
    cp_decl_reset((CPDecl *)&stack0xfffffffffffff8b0);
  } while( true );
}

Assistant:

static void cp_decl_multi(CPState *cp)
{
  int first = 1;
  while (cp->tok != CTOK_EOF) {
    CPDecl decl;
    CPscl scl;
    if (cp_opt(cp, ';')) {  /* Skip empty statements. */
      first = 0;
      continue;
    }
    if (cp->tok == '#') {  /* Workaround, since we have no preprocessor, yet. */
      BCLine hashline = cp->linenumber;
      CPToken tok = cp_next(cp);
      if (tok == CTOK_INTEGER) {
	cp_line(cp, hashline);
	continue;
      } else if (tok == CTOK_IDENT && cp_str_is(cp->str, "line")) {
	if (cp_next(cp) != CTOK_INTEGER) cp_err_token(cp, tok);
	cp_line(cp, hashline);
	continue;
      } else if (tok == CTOK_IDENT && cp_str_is(cp->str, "pragma")) {
	cp_pragma(cp, hashline);
	continue;
      } else {
	cp_errmsg(cp, cp->tok, LJ_ERR_XSYMBOL);
      }
    }
    scl = cp_decl_spec(cp, &decl, CDF_TYPEDEF|CDF_EXTERN|CDF_STATIC);
    if ((cp->tok == ';' || cp->tok == CTOK_EOF) &&
	ctype_istypedef(decl.stack[0].info)) {
      CTInfo info = ctype_rawchild(cp->cts, &decl.stack[0])->info;
      if (ctype_isstruct(info) || ctype_isenum(info))
	goto decl_end;  /* Accept empty declaration of struct/union/enum. */
    }
    for (;;) {
      CTypeID ctypeid;
      cp_declarator(cp, &decl);
      ctypeid = cp_decl_intern(cp, &decl);
      if (decl.name && !decl.nameid) {  /* NYI: redeclarations are ignored. */
	CType *ct;
	CTypeID id;
	if ((scl & CDF_TYPEDEF)) {  /* Create new typedef. */
	  id = lj_ctype_new(cp->cts, &ct);
	  ct->info = CTINFO(CT_TYPEDEF, ctypeid);
	  goto noredir;
	} else if (ctype_isfunc(ctype_get(cp->cts, ctypeid)->info)) {
	  /* Treat both static and extern function declarations as extern. */
	  ct = ctype_get(cp->cts, ctypeid);
	  /* We always get new anonymous functions (typedefs are copied). */
	  lj_assertCP(gcref(ct->name) == NULL, "unexpected named function");
	  id = ctypeid;  /* Just name it. */
	} else if ((scl & CDF_STATIC)) {  /* Accept static constants. */
	  id = cp_decl_constinit(cp, &ct, ctypeid);
	  goto noredir;
	} else {  /* External references have extern or no storage class. */
	  id = lj_ctype_new(cp->cts, &ct);
	  ct->info = CTINFO(CT_EXTERN, ctypeid);
	}
	if (decl.redir) {  /* Add attribute for redirected symbol name. */
	  CType *cta;
	  CTypeID aid = lj_ctype_new(cp->cts, &cta);
	  ct = ctype_get(cp->cts, id);  /* Table may have been reallocated. */
	  cta->info = CTINFO(CT_ATTRIB, CTATTRIB(CTA_REDIR));
	  cta->sib = ct->sib;
	  ct->sib = aid;
	  ctype_setname(cta, decl.redir);
	}
      noredir:
	ctype_setname(ct, decl.name);
	lj_ctype_addname(cp->cts, ct, id);
      }
      if (!cp_opt(cp, ',')) break;
      cp_decl_reset(&decl);
    }
  decl_end:
    if (cp->tok == CTOK_EOF && first) break;  /* May omit ';' for 1 decl. */
    first = 0;
    cp_check(cp, ';');
  }
}